

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QGraphicsItem_*,_QPointF> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QGraphicsItem*,QPointF>>::findNode<QGraphicsItem*>
          (Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *this,QGraphicsItem **key)

{
  long lVar1;
  bool bVar2;
  Node<QGraphicsItem_*,_QPointF> *pNVar3;
  QGraphicsItem **in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<QGraphicsItem*>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_>::Bucket::isUnused((Bucket *)0x9b175b);
  if (bVar2) {
    pNVar3 = (Node<QGraphicsItem_*,_QPointF> *)0x0;
  }
  else {
    pNVar3 = Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_>::Bucket::node((Bucket *)0x9b1776);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }